

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cpp
# Opt level: O1

void * __thiscall Cache::malloc(Cache *this,size_t __size)

{
  SpanList *this_00;
  Span *pSVar1;
  Span **ppSVar2;
  int iVar3;
  long lVar4;
  void *pvVar5;
  Span *this_01;
  
  lVar4 = 0x14;
  do {
    if ((int)__size <= *(int *)((long)spanInfo[0] + lVar4)) {
      lVar4 = (long)*(int *)(&UNK_00105e1c + lVar4);
      goto LAB_00104842;
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0x434);
  lVar4 = 1;
LAB_00104842:
  this_00 = this->alloc + lVar4;
  pSVar1 = this->alloc[lVar4].list;
  this_01 = pSVar1;
  if (pSVar1 == (Span *)0x0) {
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
    if (iVar3 != 0) {
LAB_0010491c:
      std::__throw_system_error(iVar3);
      halt_baddata();
    }
    __size = (size_t)Central::malloc((Central *)(&this->field_0x430 + lVar4 * 0x28),
                                     (size_t)this->spanMap);
    SpanList::pushBack(this_00,(Span *)__size);
  }
  else {
    do {
      if (this_01->allocCount < this_01->nelems) goto LAB_00104871;
      ppSVar2 = &this_01->next;
      this_01 = *ppSVar2;
    } while (*ppSVar2 != pSVar1);
    this_01 = (Span *)0x0;
LAB_00104871:
    if (this_01 != (Span *)0x0) goto LAB_0010490b;
    iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->mtx);
    if (iVar3 != 0) goto LAB_0010491c;
    __size = (size_t)Central::malloc((Central *)(&this->field_0x430 + lVar4 * 0x28),
                                     (size_t)this->spanMap);
    SpanList::pushFront(this_00,(Span *)__size);
  }
  this_01 = this_00->list;
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
LAB_0010490b:
  pvVar5 = Span::malloc(this_01,__size);
  return pvVar5;
}

Assistant:

void *Cache::malloc(int size) {
    // 根据size, 选择一个合适的class
    int spanClass = 1;
    for (int i = 1; i < spanClasses; i++) {
        if (size <= spanInfo[i][1]) {
            spanClass = spanInfo[i][0];
            break;
        }
    }
    SpanList* spanList = &(this->alloc[spanClass]);  // 要用指针!
    /*
     * 三种情况
     * 1. 列表中没有一个span, 即 span == nullptr
     * 2. 列表中有span, 但是都没有了空间
     * 3. 列表中有span, 并且存在空间, 可以分配
     *
     * 情况 1, 2 都需要向central中请求空间
     */
    Span* span = nullptr;
    if (spanList->list == nullptr) {  // 情况 1
        // 锁
        mtx.lock();
        spanList->pushBack(ctl[spanClass].malloc(spanMap));  // central.malloc 会返回一个 span指针
        span = spanList->list;
        // 解锁
        mtx.unlock();
    } else {
        auto p = spanList->list;
        do {
            if (p->allocCount < p->nelems) {  // 有可分配的
                span = p;  // 第三种情况
                break;
            }
            p = p->next;
        } while (p != spanList->list);
        if (span == nullptr) {  // 第二种情况
            // 锁
            mtx.lock();
            spanList->pushFront(ctl[spanClass].malloc(spanMap));
            span = spanList->list;
            // 解锁
            mtx.unlock();
        }
    }
    return span->malloc();
}